

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

void ikcp_flush(ikcpcb *kcp)

{
  int *piVar1;
  IUINT32 IVar2;
  IUINT32 IVar3;
  IUINT32 IVar4;
  IUINT32 *data;
  IQUEUEHEAD *pIVar5;
  bool bVar6;
  undefined2 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  IINT32 *pIVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong __n;
  IUINT32 IVar15;
  IUINT32 IVar16;
  IUINT32 IVar17;
  IKCPSEG *segment;
  IQUEUEHEAD *pIVar18;
  long lVar19;
  int iVar20;
  IUINT32 *__dest;
  bool bVar21;
  int local_50;
  int local_4c;
  
  if (kcp->updated != 0) {
    IVar2 = kcp->current;
    data = (IUINT32 *)kcp->buffer;
    IVar16 = kcp->conv;
    IVar3 = kcp->rcv_nxt;
    IVar15 = 0;
    iVar8 = kcp->rcv_wnd - kcp->nrcv_que;
    if (kcp->rcv_wnd < kcp->nrcv_que) {
      iVar8 = 0;
    }
    IVar4 = kcp->ackcount;
    IVar17 = 0;
    iVar20 = (int)data;
    uVar7 = (undefined2)iVar8;
    __dest = data;
    if (0 < (long)(int)IVar4) {
      lVar19 = 0;
      do {
        iVar13 = (int)__dest - iVar20;
        if ((int)kcp->mtu < iVar13 + 0x18) {
          ikcp_output(kcp,data,iVar13);
          __dest = data;
        }
        IVar17 = kcp->acklist[lVar19 * 2];
        IVar15 = kcp->acklist[lVar19 * 2 + 1];
        *__dest = IVar16;
        *(undefined2 *)(__dest + 1) = 0x52;
        *(undefined2 *)((long)__dest + 6) = uVar7;
        __dest[2] = IVar15;
        __dest[3] = IVar17;
        __dest[4] = IVar3;
        __dest[5] = 0;
        __dest = __dest + 6;
        lVar19 = lVar19 + 1;
      } while ((int)IVar4 != lVar19);
    }
    kcp->ackcount = 0;
    if (kcp->rmt_wnd == 0) {
      if (kcp->probe_wait == 0) {
        kcp->probe_wait = 7000;
        kcp->ts_probe = kcp->current + 7000;
      }
      else if (-1 < (int)(kcp->current - kcp->ts_probe)) {
        if (kcp->probe_wait < 7000) {
          kcp->probe_wait = 7000;
        }
        uVar14 = (kcp->probe_wait >> 1) + kcp->probe_wait;
        if (119999 < uVar14) {
          uVar14 = 120000;
        }
        kcp->probe_wait = uVar14;
        kcp->ts_probe = uVar14 + kcp->current;
        *(byte *)&kcp->probe = (byte)kcp->probe | 1;
      }
    }
    else {
      kcp->ts_probe = 0;
      kcp->probe_wait = 0;
    }
    if ((kcp->probe & 1) != 0) {
      iVar13 = (int)__dest - iVar20;
      if ((int)kcp->mtu < iVar13 + 0x18) {
        ikcp_output(kcp,data,iVar13);
        __dest = data;
      }
      *__dest = IVar16;
      *(undefined2 *)(__dest + 1) = 0x53;
      *(undefined2 *)((long)__dest + 6) = uVar7;
      __dest[2] = IVar15;
      __dest[3] = IVar17;
      __dest[4] = IVar3;
      __dest[5] = 0;
      __dest = __dest + 6;
    }
    if ((kcp->probe & 2) != 0) {
      iVar13 = (int)__dest - iVar20;
      if ((int)kcp->mtu < iVar13 + 0x18) {
        ikcp_output(kcp,data,iVar13);
        __dest = data;
      }
      *__dest = IVar16;
      *(undefined2 *)(__dest + 1) = 0x54;
      *(undefined2 *)((long)__dest + 6) = uVar7;
      __dest[2] = IVar15;
      __dest[3] = IVar17;
      __dest[4] = IVar3;
      __dest[5] = 0;
      __dest = __dest + 6;
    }
    kcp->probe = 0;
    uVar14 = kcp->rmt_wnd;
    if (kcp->snd_wnd < kcp->rmt_wnd) {
      uVar14 = kcp->snd_wnd;
    }
    if ((kcp->nocwnd == 0) && (kcp->cwnd < uVar14)) {
      uVar14 = kcp->cwnd;
    }
    iVar13 = kcp->snd_una + uVar14;
    if ((int)(kcp->snd_nxt - iVar13) < 0) {
      IVar16 = kcp->snd_nxt;
      do {
        pIVar18 = (kcp->snd_queue).next;
        if (&kcp->snd_queue == pIVar18) break;
        pIVar5 = pIVar18->next;
        pIVar5->prev = pIVar18->prev;
        pIVar18->prev->next = pIVar5;
        pIVar18->next = (IQUEUEHEAD *)0x0;
        pIVar18->prev = (IQUEUEHEAD *)0x0;
        pIVar5 = (kcp->snd_buf).prev;
        pIVar18->prev = pIVar5;
        pIVar18->next = &kcp->snd_buf;
        pIVar5->next = pIVar18;
        (kcp->snd_buf).prev = pIVar18;
        kcp->nsnd_que = kcp->nsnd_que - 1;
        kcp->nsnd_buf = kcp->nsnd_buf + 1;
        *(IUINT32 *)&pIVar18[1].next = kcp->conv;
        *(undefined4 *)((long)&pIVar18[1].next + 4) = 0x51;
        *(int *)((long)&pIVar18[1].prev + 4) = iVar8;
        *(IUINT32 *)&pIVar18[2].next = IVar2;
        IVar3 = IVar16 + 1;
        kcp->snd_nxt = IVar3;
        *(IUINT32 *)((long)&pIVar18[2].next + 4) = IVar16;
        *(IUINT32 *)&pIVar18[2].prev = kcp->rcv_nxt;
        *(IUINT32 *)&pIVar18[3].next = IVar2;
        *(IINT32 *)((long)&pIVar18[3].next + 4) = kcp->rx_rto;
        pIVar18[3].prev = (IQUEUEHEAD *)0x0;
        IVar16 = IVar3;
      } while ((int)(IVar3 - iVar13) < 0);
    }
    uVar12 = 0xffffffff;
    if (0 < kcp->fastresend) {
      uVar12 = kcp->fastresend;
    }
    local_50 = 0;
    if (kcp->nodelay == 0) {
      local_50 = kcp->rx_rto >> 3;
    }
    pIVar18 = (kcp->snd_buf).next;
    if (pIVar18 == &kcp->snd_buf) {
      bVar21 = true;
      bVar6 = true;
    }
    else {
      bVar6 = false;
      local_4c = 0;
      do {
        iVar13 = *(int *)((long)&pIVar18[3].prev + 4);
        if (iVar13 == 0) {
          *(undefined4 *)((long)&pIVar18[3].prev + 4) = 1;
          iVar13 = kcp->rx_rto;
          *(int *)((long)&pIVar18[3].next + 4) = iVar13;
          *(IUINT32 *)&pIVar18[3].next = iVar13 + local_50 + IVar2;
LAB_00134be1:
          bVar21 = false;
        }
        else {
          if (-1 < (int)(IVar2 - *(int *)&pIVar18[3].next)) {
            *(int *)((long)&pIVar18[3].prev + 4) = iVar13 + 1;
            kcp->xmit = kcp->xmit + 1;
            if (kcp->nodelay == 1) {
              pIVar11 = (IINT32 *)((long)&pIVar18[3].next + 4);
LAB_00134bbd:
              piVar1 = (int *)((long)&pIVar18[3].next + 4);
              *piVar1 = *piVar1 + *pIVar11 / 2;
            }
            else {
              pIVar11 = &kcp->rx_rto;
              if (kcp->nodelay != 0) goto LAB_00134bbd;
              uVar10 = *(uint *)((long)&pIVar18[3].next + 4);
              uVar9 = kcp->rx_rto;
              if ((uint)kcp->rx_rto < uVar10) {
                uVar9 = uVar10;
              }
              *(uint *)((long)&pIVar18[3].next + 4) = uVar9 + uVar10;
            }
            *(IUINT32 *)&pIVar18[3].next = *(int *)((long)&pIVar18[3].next + 4) + IVar2;
            bVar6 = true;
            goto LAB_00134be1;
          }
          bVar21 = true;
          if ((uVar12 <= *(uint *)&pIVar18[3].prev) &&
             (iVar13 <= kcp->fastlimit || kcp->fastlimit < 1)) {
            *(int *)((long)&pIVar18[3].prev + 4) = iVar13 + 1;
            *(undefined4 *)&pIVar18[3].prev = 0;
            *(IUINT32 *)&pIVar18[3].next = *(int *)((long)&pIVar18[3].next + 4) + IVar2;
            local_4c = local_4c + 1;
            goto LAB_00134be1;
          }
        }
        if (!bVar21) {
          *(IUINT32 *)&pIVar18[2].next = IVar2;
          *(int *)((long)&pIVar18[1].prev + 4) = iVar8;
          *(IUINT32 *)&pIVar18[2].prev = kcp->rcv_nxt;
          iVar13 = (int)__dest - iVar20;
          if ((int)kcp->mtu < *(int *)((long)&pIVar18[2].prev + 4) + iVar13 + 0x18) {
            ikcp_output(kcp,data,iVar13);
            __dest = data;
          }
          *__dest = *(IUINT32 *)&pIVar18[1].next;
          *(char *)(__dest + 1) = *(char *)((long)&pIVar18[1].next + 4);
          *(char *)((long)__dest + 5) = *(char *)&pIVar18[1].prev;
          *(undefined2 *)((long)__dest + 6) = *(undefined2 *)((long)&pIVar18[1].prev + 4);
          __dest[2] = *(IUINT32 *)&pIVar18[2].next;
          __dest[3] = *(IUINT32 *)((long)&pIVar18[2].next + 4);
          __dest[4] = *(IUINT32 *)&pIVar18[2].prev;
          __dest[5] = *(IUINT32 *)((long)&pIVar18[2].prev + 4);
          __dest = __dest + 6;
          __n = (ulong)*(uint *)((long)&pIVar18[2].prev + 4);
          if (__n != 0) {
            memcpy(__dest,pIVar18 + 4,__n);
            __dest = (IUINT32 *)((long)__dest + (ulong)*(uint *)((long)&pIVar18[2].prev + 4));
          }
          if (kcp->dead_link <= *(uint *)((long)&pIVar18[3].prev + 4)) {
            kcp->state = 0xffffffff;
          }
        }
        pIVar18 = pIVar18->next;
      } while (pIVar18 != &kcp->snd_buf);
      bVar21 = local_4c == 0;
      bVar6 = !bVar6;
    }
    iVar20 = (int)__dest - iVar20;
    if (0 < iVar20) {
      ikcp_output(kcp,data,iVar20);
    }
    if (!bVar21) {
      uVar9 = kcp->snd_nxt - kcp->snd_una;
      uVar10 = 2;
      if (3 < uVar9) {
        uVar10 = uVar9 >> 1;
      }
      kcp->ssthresh = uVar10;
      kcp->cwnd = uVar10 + uVar12;
      kcp->incr = (uVar10 + uVar12) * kcp->mss;
    }
    if (!bVar6) {
      uVar12 = 2;
      if (3 < uVar14) {
        uVar12 = uVar14 >> 1;
      }
      kcp->ssthresh = uVar12;
      kcp->cwnd = 1;
      kcp->incr = kcp->mss;
    }
    if (kcp->cwnd == 0) {
      kcp->cwnd = 1;
      kcp->incr = kcp->mss;
    }
  }
  return;
}

Assistant:

void ikcp_flush(ikcpcb *kcp)
{
	IUINT32 current = kcp->current;
	char *buffer = kcp->buffer;
	char *ptr = buffer;
	int count, size, i;
	IUINT32 resent, cwnd;
	IUINT32 rtomin;
	struct IQUEUEHEAD *p;
	int change = 0;
	int lost = 0;
	IKCPSEG seg;

	// 'ikcp_update' haven't been called. 
	if (kcp->updated == 0) return;

	seg.conv = kcp->conv;
	seg.cmd = IKCP_CMD_ACK;
	seg.frg = 0;
	seg.wnd = ikcp_wnd_unused(kcp);
	seg.una = kcp->rcv_nxt;
	seg.len = 0;
	seg.sn = 0;
	seg.ts = 0;

	// flush acknowledges
	count = kcp->ackcount;
	for (i = 0; i < count; i++) {
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ikcp_ack_get(kcp, i, &seg.sn, &seg.ts);
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->ackcount = 0;

	// probe window size (if remote window size equals zero)
	if (kcp->rmt_wnd == 0) {
		if (kcp->probe_wait == 0) {
			kcp->probe_wait = IKCP_PROBE_INIT;
			kcp->ts_probe = kcp->current + kcp->probe_wait;
		}	
		else {
			if (_itimediff(kcp->current, kcp->ts_probe) >= 0) {
				if (kcp->probe_wait < IKCP_PROBE_INIT) 
					kcp->probe_wait = IKCP_PROBE_INIT;
				kcp->probe_wait += kcp->probe_wait / 2;
				if (kcp->probe_wait > IKCP_PROBE_LIMIT)
					kcp->probe_wait = IKCP_PROBE_LIMIT;
				kcp->ts_probe = kcp->current + kcp->probe_wait;
				kcp->probe |= IKCP_ASK_SEND;
			}
		}
	}	else {
		kcp->ts_probe = 0;
		kcp->probe_wait = 0;
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_SEND) {
		seg.cmd = IKCP_CMD_WASK;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_TELL) {
		seg.cmd = IKCP_CMD_WINS;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->probe = 0;

	// calculate window size
	cwnd = _imin_(kcp->snd_wnd, kcp->rmt_wnd);
	if (kcp->nocwnd == 0) cwnd = _imin_(kcp->cwnd, cwnd);

	// move data from snd_queue to snd_buf
	while (_itimediff(kcp->snd_nxt, kcp->snd_una + cwnd) < 0) {
		IKCPSEG *newseg;
		if (iqueue_is_empty(&kcp->snd_queue)) break;

		newseg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);

		iqueue_del(&newseg->node);
		iqueue_add_tail(&newseg->node, &kcp->snd_buf);
		kcp->nsnd_que--;
		kcp->nsnd_buf++;

		newseg->conv = kcp->conv;
		newseg->cmd = IKCP_CMD_PUSH;
		newseg->wnd = seg.wnd;
		newseg->ts = current;
		newseg->sn = kcp->snd_nxt++;
		newseg->una = kcp->rcv_nxt;
		newseg->resendts = current;
		newseg->rto = kcp->rx_rto;
		newseg->fastack = 0;
		newseg->xmit = 0;
	}

	// calculate resent
	resent = (kcp->fastresend > 0)? (IUINT32)kcp->fastresend : 0xffffffff;
	rtomin = (kcp->nodelay == 0)? (kcp->rx_rto >> 3) : 0;

	// flush data segments
	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = p->next) {
		IKCPSEG *segment = iqueue_entry(p, IKCPSEG, node);
		int needsend = 0;
		if (segment->xmit == 0) {
			needsend = 1;
			segment->xmit++;
			segment->rto = kcp->rx_rto;
			segment->resendts = current + segment->rto + rtomin;
		}
		else if (_itimediff(current, segment->resendts) >= 0) {
			needsend = 1;
			segment->xmit++;
			kcp->xmit++;
			if (kcp->nodelay == 0) {
				segment->rto += _imax_(segment->rto, (IUINT32)kcp->rx_rto);
			}	else {
				IINT32 step = (kcp->nodelay < 2)? 
					((IINT32)(segment->rto)) : kcp->rx_rto;
				segment->rto += step / 2;
			}
			segment->resendts = current + segment->rto;
			lost = 1;
		}
		else if (segment->fastack >= resent) {
			if ((int)segment->xmit <= kcp->fastlimit || 
				kcp->fastlimit <= 0) {
				needsend = 1;
				segment->xmit++;
				segment->fastack = 0;
				segment->resendts = current + segment->rto;
				change++;
			}
		}

		if (needsend) {
			int need;
			segment->ts = current;
			segment->wnd = seg.wnd;
			segment->una = kcp->rcv_nxt;

			size = (int)(ptr - buffer);
			need = IKCP_OVERHEAD + segment->len;

			if (size + need > (int)kcp->mtu) {
				ikcp_output(kcp, buffer, size);
				ptr = buffer;
			}

			ptr = ikcp_encode_seg(ptr, segment);

			if (segment->len > 0) {
				memcpy(ptr, segment->data, segment->len);
				ptr += segment->len;
			}

			if (segment->xmit >= kcp->dead_link) {
				kcp->state = (IUINT32)-1;
			}
		}
	}

	// flash remain segments
	size = (int)(ptr - buffer);
	if (size > 0) {
		ikcp_output(kcp, buffer, size);
	}

	// update ssthresh
	if (change) {
		IUINT32 inflight = kcp->snd_nxt - kcp->snd_una;
		kcp->ssthresh = inflight / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = kcp->ssthresh + resent;
		kcp->incr = kcp->cwnd * kcp->mss;
	}

	if (lost) {
		kcp->ssthresh = cwnd / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}

	if (kcp->cwnd < 1) {
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}
}